

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::LogicalType::write(LogicalType *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  size_t sVar5;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *pTVar6;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"LogicalType");
  if (((ushort)this->__isset & 1) != 0) {
    sVar5 = 1;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"STRING",0xc);
    sVar4 = StringType::write((StringType *)pTVar6,__fd,__buf_00,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 2) != 0) {
    sVar5 = 2;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"MAP",0xc);
    sVar4 = MapType::write((MapType *)pTVar6,__fd,__buf_01,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 4) != 0) {
    sVar5 = 3;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"LIST",0xc);
    sVar4 = ListType::write((ListType *)pTVar6,__fd,__buf_02,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 8) != 0) {
    sVar5 = 4;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"ENUM",0xc);
    sVar4 = EnumType::write((EnumType *)pTVar6,__fd,__buf_03,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 0x10) != 0) {
    sVar5 = 5;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"DECIMAL",0xc);
    sVar4 = DecimalType::write(&this->DECIMAL,__fd,__buf_04,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 0x20) != 0) {
    sVar5 = 6;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"DATE",0xc);
    sVar4 = DateType::write((DateType *)pTVar6,__fd,__buf_05,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 0x40) != 0) {
    sVar5 = 7;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"TIME",0xc);
    sVar4 = TimeType::write(&this->TIME,__fd,__buf_06,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((ushort)this->__isset & 0x80) != 0) {
    sVar5 = 8;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"TIMESTAMP",0xc);
    sVar4 = TimestampType::write(&this->TIMESTAMP,__fd,__buf_07,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 1) != 0) {
    sVar5 = 10;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"INTEGER",0xc);
    sVar4 = IntType::write(&this->INTEGER,__fd,__buf_08,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 2) != 0) {
    sVar5 = 0xb;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"UNKNOWN",0xc);
    sVar4 = NullType::write((NullType *)pTVar6,__fd,__buf_09,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 4) != 0) {
    sVar5 = 0xc;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"JSON",0xc);
    sVar4 = JsonType::write((JsonType *)pTVar6,__fd,__buf_10,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 8) != 0) {
    sVar5 = 0xd;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"BSON",0xc);
    sVar4 = BsonType::write((BsonType *)pTVar6,__fd,__buf_11,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 0x10) != 0) {
    sVar5 = 0xe;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"UUID",0xc);
    sVar4 = UUIDType::write((UUIDType *)pTVar6,__fd,__buf_12,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((this->__isset).field_0x1 & 0x20) != 0) {
    sVar5 = 0xf;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"FLOAT16",0xc);
    sVar4 = Float16Type::write((Float16Type *)pTVar6,__fd,__buf_13,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t LogicalType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("LogicalType");

  if (this->__isset.STRING) {
    xfer += oprot->writeFieldBegin("STRING", ::apache::thrift::protocol::T_STRUCT, 1);
    xfer += this->STRING.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.MAP) {
    xfer += oprot->writeFieldBegin("MAP", ::apache::thrift::protocol::T_STRUCT, 2);
    xfer += this->MAP.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.LIST) {
    xfer += oprot->writeFieldBegin("LIST", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->LIST.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.ENUM) {
    xfer += oprot->writeFieldBegin("ENUM", ::apache::thrift::protocol::T_STRUCT, 4);
    xfer += this->ENUM.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.DECIMAL) {
    xfer += oprot->writeFieldBegin("DECIMAL", ::apache::thrift::protocol::T_STRUCT, 5);
    xfer += this->DECIMAL.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.DATE) {
    xfer += oprot->writeFieldBegin("DATE", ::apache::thrift::protocol::T_STRUCT, 6);
    xfer += this->DATE.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.TIME) {
    xfer += oprot->writeFieldBegin("TIME", ::apache::thrift::protocol::T_STRUCT, 7);
    xfer += this->TIME.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.TIMESTAMP) {
    xfer += oprot->writeFieldBegin("TIMESTAMP", ::apache::thrift::protocol::T_STRUCT, 8);
    xfer += this->TIMESTAMP.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.INTEGER) {
    xfer += oprot->writeFieldBegin("INTEGER", ::apache::thrift::protocol::T_STRUCT, 10);
    xfer += this->INTEGER.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.UNKNOWN) {
    xfer += oprot->writeFieldBegin("UNKNOWN", ::apache::thrift::protocol::T_STRUCT, 11);
    xfer += this->UNKNOWN.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.JSON) {
    xfer += oprot->writeFieldBegin("JSON", ::apache::thrift::protocol::T_STRUCT, 12);
    xfer += this->JSON.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.BSON) {
    xfer += oprot->writeFieldBegin("BSON", ::apache::thrift::protocol::T_STRUCT, 13);
    xfer += this->BSON.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.UUID) {
    xfer += oprot->writeFieldBegin("UUID", ::apache::thrift::protocol::T_STRUCT, 14);
    xfer += this->UUID.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.FLOAT16) {
    xfer += oprot->writeFieldBegin("FLOAT16", ::apache::thrift::protocol::T_STRUCT, 15);
    xfer += this->FLOAT16.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}